

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcPath::~IfcPath(IfcPath *this)

{
  void *pvVar1;
  
  (this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x823460;
  *(undefined8 *)&this->field_0x48 = 0x8234d8;
  *(undefined8 *)
   &(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x823488;
  *(undefined8 *)
   &(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x8234b0;
  pvVar1 = *(void **)&(this->super_IfcTopologicalRepresentationItem).field_0x30;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&this->field_0x40 - (long)pvVar1);
  }
  operator_delete(this,0x60);
  return;
}

Assistant:

IfcPath() : Object("IfcPath") {}